

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O1

void __thiscall NoViableAltException::NoViableAltException(NoViableAltException *this,RefAST *t)

{
  Ref *pRVar1;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"NoViableAlt","");
  ParserException::ParserException(&this->super_ParserException,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_ParserException).super_ANTLRException =
       &PTR__NoViableAltException_00243ab8;
  (this->token).ref = (Ref *)0x0;
  pRVar1 = t->ref;
  if (pRVar1 == (Ref *)0x0) {
    pRVar1 = (Ref *)0x0;
  }
  else {
    pRVar1->count = pRVar1->count + 1;
  }
  (this->node).ref = pRVar1;
  return;
}

Assistant:

NoViableAltException::NoViableAltException(RefAST t)
: ParserException("NoViableAlt")
, token(0)
, node(t)
{
}